

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_array_add_mod_ref(lysc_ctx *ctx,lys_module *mod,lys_module ***mod_array)

{
  lys_module **pplVar1;
  lys_module *plVar2;
  lys_module *local_50;
  undefined8 *local_40;
  char *p__;
  lys_module **new_mod;
  uint64_t u;
  lys_module ***mod_array_local;
  lys_module *mod_local;
  lysc_ctx *ctx_local;
  
  new_mod = (lys_module **)0x0;
  while( true ) {
    if (*mod_array == (lys_module **)0x0) {
      local_50 = (lys_module *)0x0;
    }
    else {
      local_50 = (*mod_array)[-1];
    }
    if (local_50 <= new_mod) break;
    if ((*mod_array)[(long)new_mod] == mod) {
      return LY_EEXIST;
    }
    new_mod = (lys_module **)((long)new_mod + 1);
  }
  if (*mod_array == (lys_module **)0x0) {
    local_40 = (undefined8 *)malloc(0x10);
    if (local_40 == (undefined8 *)0x0) {
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_array_add_mod_ref");
      return LY_EMEM;
    }
    *local_40 = 1;
  }
  else {
    (*mod_array)[-1] = (lys_module *)((long)&(*mod_array)[-1]->ctx + 1);
    local_40 = (undefined8 *)realloc(*mod_array + -1,(long)(*mod_array)[-1] * 8 + 8);
    if (local_40 == (undefined8 *)0x0) {
      (*mod_array)[-1] = (lys_module *)&(*mod_array)[-1][-1].field_0x7f;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_array_add_mod_ref");
      return LY_EMEM;
    }
  }
  *mod_array = (lys_module **)(local_40 + 1);
  pplVar1 = *mod_array;
  plVar2 = (*mod_array)[-1];
  memset(pplVar1 + (long)&plVar2[-1].field_0x7f,0,8);
  pplVar1[(long)&plVar2[-1].field_0x7f] = mod;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lys_array_add_mod_ref(struct lysc_ctx *ctx, struct lys_module *mod, struct lys_module ***mod_array)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lys_module **new_mod;

    LY_ARRAY_FOR(*mod_array, u) {
        if ((*mod_array)[u] == mod) {
            /* already there */
            return LY_EEXIST;
        }
    }

    /* add the new module ref */
    LY_ARRAY_NEW_RET(ctx->ctx, *mod_array, new_mod, LY_EMEM);
    *new_mod = mod;

    return LY_SUCCESS;
}